

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformNamedArg(Transformer *this,PGNamedArgExpr *root)

{
  pointer pPVar1;
  long in_RDX;
  pointer *__ptr;
  allocator local_39;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  TransformExpression(this,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
  if (*(long *)(in_RDX + 0x10) != 0) {
    pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)this);
    ::std::__cxx11::string::string((string *)local_38,*(char **)(in_RDX + 0x10),&local_39);
    ::std::__cxx11::string::operator=
              ((string *)&(pPVar1->super_BaseExpression).alias,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformNamedArg(duckdb_libpgquery::PGNamedArgExpr &root) {

	auto expr = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(root.arg));
	if (root.name) {
		expr->SetAlias(root.name);
	}
	return expr;
}